

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_base.c
# Opt level: O2

void get_msb_lsb_at_pos(RK_U32 *msb,RK_U32 *lsb,RK_U8 *buf,RK_U32 bytepos)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  puVar1 = (uint *)(buf + (bytepos & 0xfffffff8));
  uVar2 = bytepos & 7;
  uVar4 = (ulong)uVar2;
  if (uVar2 != 0) {
    for (; uVar4 != 8; uVar4 = uVar4 + 1) {
      *(undefined1 *)((long)puVar1 + uVar4) = 0;
    }
  }
  uVar3 = *puVar1;
  *msb = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = 0;
  if (4 < uVar2) {
    uVar3 = (uint)*(byte *)((long)puVar1 + 6) << 8 |
            (uint)*(byte *)((long)puVar1 + 5) << 0x10 | (uint)(byte)puVar1[1] << 0x18;
  }
  *lsb = uVar3;
  return;
}

Assistant:

void get_msb_lsb_at_pos(RK_U32 *msb, RK_U32 *lsb, RK_U8 *buf, RK_U32 bytepos)
{
    RK_U32 val32;
    RK_S32 left_byte = bytepos & 0x7;
    RK_U8 *tmp = buf + (bytepos & (~0x7));

    // clear the rest bytes in 64bit
    if (left_byte) {
        RK_U32 i;

        for (i = left_byte; i < 8; i++)
            tmp[i] = 0;
    }

    val32 = (tmp[0] << 24) |
            (tmp[1] << 16) |
            (tmp[2] <<  8) |
            (tmp[3] <<  0);

    *msb = val32;

    if (left_byte > 4) {
        val32 = (tmp[4] << 24) |
                (tmp[5] << 16) |
                (tmp[6] <<  8);
    } else
        val32 = 0;

    *lsb = val32;
}